

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Parser::Parser(Parser *this,uint32_t *spirv_data,size_t word_count)

{
  uint *__last;
  size_t __first;
  allocator<unsigned_int> local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  size_t local_20;
  size_t word_count_local;
  uint32_t *spirv_data_local;
  Parser *this_local;
  
  local_20 = word_count;
  word_count_local = (size_t)spirv_data;
  spirv_data_local = (uint32_t *)this;
  ParsedIR::ParsedIR(&this->ir);
  this->current_function = (SPIRFunction *)0x0;
  this->current_block = (SPIRBlock *)0x0;
  this->ignore_trailing_block_opcodes = false;
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->global_struct_cache);
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::SmallVector
            (&this->forward_pointer_fixups);
  __first = word_count_local;
  __last = (uint *)(word_count_local + local_20 * 4);
  ::std::allocator<unsigned_int>::allocator(&local_39);
  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,(uint *)__first,__last,
             &local_39);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&(this->ir).spirv,&local_38)
  ;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  ::std::allocator<unsigned_int>::~allocator(&local_39);
  return;
}

Assistant:

Parser::Parser(const uint32_t *spirv_data, size_t word_count)
{
	ir.spirv = vector<uint32_t>(spirv_data, spirv_data + word_count);
}